

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

QList<QSslCipher> * QSslSocketPrivate::defaultDtlsCiphers(void)

{
  QSslConfigurationPrivate *pQVar1;
  __pointer_type pQVar2;
  Type *pTVar3;
  Type *pTVar4;
  Type *in_RDI;
  bool bVar5;
  
  pTVar4 = in_RDI;
  ensureInitialized();
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar4);
  if (pTVar3 != (Type *)0x0) {
    if ((pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar5 = (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar5) {
        (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar5) goto LAB_0016e6a1;
    }
    pTVar4 = pTVar3;
    QBasicMutex::lockInternal();
  }
LAB_0016e6a1:
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>
                       *)pTVar4);
  pQVar1 = (pTVar4->dtlsConfig).d.ptr;
  pQVar2 = (__pointer_type)(pQVar1->ciphers).d.d;
  (in_RDI->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = pQVar2;
  (in_RDI->supportedCiphers).d.d = (Data *)(pQVar1->ciphers).d.ptr;
  (in_RDI->supportedCiphers).d.ptr = (QSslCipher *)(pQVar1->ciphers).d.size;
  if (pQVar2 != (__pointer_type)0x0) {
    LOCK();
    *(int *)pQVar2 = *(int *)pQVar2 + 1;
    UNLOCK();
  }
  if (pTVar3 != (Type *)0x0) {
    LOCK();
    pQVar2 = (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
    (pTVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar2 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(pTVar3);
    }
  }
  return (QList<QSslCipher> *)in_RDI;
}

Assistant:

QList<QSslCipher> QSslSocketPrivate::defaultDtlsCiphers()
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);
    return globalData()->dtlsConfig->ciphers;
}